

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

QAction * __thiscall QtMWidgets::ToolBar::actionAt(ToolBar *this,QPoint *p)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  ToolBarPrivate *pTVar4;
  long *plVar5;
  QAction *pQVar6;
  ToolButton *local_40;
  ToolButton *b;
  QLayoutItem *item;
  int index;
  QWidget *widget;
  QPoint *p_local;
  ToolBar *this_local;
  
  uVar3 = QWidget::childAt((QPoint *)this);
  pTVar4 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
           ::operator->(&this->d);
  iVar1 = (**(code **)(*(long *)pTVar4->layout + 0xb8))(pTVar4->layout,uVar3);
  if ((iVar1 != -1) && (iVar1 != 0)) {
    pTVar4 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    iVar2 = (**(code **)(*(long *)pTVar4->layout + 200))();
    if (iVar1 != iVar2 + 1) {
      pTVar4 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
               ::operator->(&this->d);
      plVar5 = (long *)(**(code **)(*(long *)pTVar4->layout + 0xa8))(pTVar4->layout,iVar1);
      local_40 = (ToolButton *)0x0;
      if (plVar5 != (long *)0x0) {
        local_40 = (ToolButton *)(**(code **)(*plVar5 + 0x68))();
      }
      if (local_40 != (ToolButton *)0x0) {
        pQVar6 = ToolButton::action(local_40);
        return pQVar6;
      }
      return (QAction *)0x0;
    }
  }
  return (QAction *)0x0;
}

Assistant:

QAction *
ToolBar::actionAt( const QPoint & p ) const
{
	QWidget * widget = childAt( p );

	int index = d->layout->indexOf( widget );

	if( index == -1 || index == 0 || index == d->layout->count() + 1 )
		return 0;

	QLayoutItem * item = d->layout->itemAt( index );

	ToolButton * b = 0;

	if( item )
		b = static_cast< ToolButton* > ( item->widget() );

	if( b )
		return b->action();
	else
		return 0;
}